

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::TexImage2D::exec(TexImage2D *this,Thread *t)

{
  code *pcVar1;
  deUint32 dVar2;
  deBool dVar3;
  MessageBuilder *pMVar4;
  Texture *pTVar5;
  MessageBuilder local_9a0;
  MessageBuilder local_810;
  MessageBuilder local_680;
  MessageBuilder local_4f0;
  MessageBuilder local_360;
  MessageBuilder local_1c0;
  deUint8 *local_30;
  void *dummyData;
  EGLThread *thread;
  Thread *t_local;
  TexImage2D *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  dummyData = (void *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if ((Thread *)dummyData == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  local_30 = tcu::ThreadUtil::Thread::getDummyData
                       ((Thread *)dummyData,(long)(this->m_width * this->m_height * 4));
  tcu::ThreadUtil::Thread::newMessage(&local_1c0,(Thread *)dummyData);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1c0,(char (*) [39])"Begin -- glBindTexture(GL_TEXTURE_2D, ");
  pTVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pTVar5->texture);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2a85ff4);
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1c0);
  do {
    pcVar1 = *(code **)(*(long *)((long)dummyData + 0x88) + 0xb8);
    pTVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
    (*pcVar1)(0xde1,pTVar5->texture);
    dVar2 = (**(code **)(*(long *)((long)dummyData + 0x88) + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x3d8);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_360,(Thread *)dummyData);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_360,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_360);
  tcu::ThreadUtil::Thread::newMessage(&local_4f0,(Thread *)dummyData);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_4f0,(char (*) [38])"Begin -- glTexImage2D(GL_TEXTURE_2D, ");
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_level);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_internalFormat);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_width);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_height);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [6])0x2a1c758);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_format);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a3caab);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&this->m_type);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [8])", data)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4f0);
  do {
    (**(code **)(*(long *)((long)dummyData + 0x88) + 0x1310))
              (0xde1,this->m_level,this->m_internalFormat,this->m_width,this->m_height,0,
               this->m_format,this->m_type,local_30);
    dVar2 = (**(code **)(*(long *)((long)dummyData + 0x88) + 0x800))();
    glu::checkError(dVar2,
                    "texImage2D(GL_TEXTURE_2D, m_level, m_internalFormat, m_width, m_height, 0, m_format, m_type, dummyData)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x3dc);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_680,(Thread *)dummyData);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_680,(char (*) [22])"End -- glTexImage2D()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_680);
  tcu::ThreadUtil::Thread::newMessage(&local_810,(Thread *)dummyData);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_810,(char (*) [41])"Begin -- glBindTexture(GL_TEXTURE_2D, 0)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_810);
  do {
    (**(code **)(*(long *)((long)dummyData + 0x88) + 0xb8))(0xde1,0);
    dVar2 = (**(code **)(*(long *)((long)dummyData + 0x88) + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x3e0);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_9a0,(Thread *)dummyData);
  pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_9a0,(char (*) [23])"End -- glBindTexture()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_9a0);
  return;
}

Assistant:

void TexImage2D::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	void* dummyData = thread.getDummyData(m_width*m_height*4);

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glTexImage2D(GL_TEXTURE_2D, " << m_level << ", " << m_internalFormat << ", " << m_width << ", " << m_height << ", 0, " << m_format << ", " << m_type << ", data)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, texImage2D(GL_TEXTURE_2D, m_level, m_internalFormat, m_width, m_height, 0, m_format, m_type, dummyData));
	thread.newMessage() << "End -- glTexImage2D()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}